

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void safe_fprintf(FILE_conflict *f,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  bool bVar8;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint uVar9;
  uint uVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t buffsize;
  char *__s;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  wchar_t wc;
  va_list ap;
  char outbuff [256];
  char fmtbuff_stack [256];
  wchar_t local_31c;
  FILE *local_318;
  char *local_310;
  undefined8 local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char local_2e8 [256];
  char local_1e8 [256];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 *__arg;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  __arg = &local_308;
  local_308 = 0x3000000010;
  local_300 = &stack0x00000008;
  local_318 = (FILE *)f;
  local_2f8 = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  uVar3 = vsnprintf(local_1e8,0x100,fmt,__arg);
  if (uVar3 < 0x100) {
    local_310 = (char *)0x0;
    __s = local_1e8;
  }
  else {
    bVar1 = 0xff < (int)uVar3;
    local_310 = (char *)0x0;
    __s = local_1e8;
    uVar9 = uVar3;
    uVar10 = 0x100;
    do {
      uVar3 = uVar10;
      if (bVar1) {
        uVar10 = uVar9 + 1;
      }
      else if ((int)uVar3 < 0x2000) {
        uVar10 = uVar3 * 2;
      }
      else {
        if (999999 < uVar3) {
          local_310[uVar3 - 1] = '\0';
          break;
        }
        uVar10 = uVar3 + (uVar3 >> 2);
      }
      free(local_310);
      local_310 = (char *)malloc((ulong)uVar10);
      if (local_310 == (char *)0x0) {
        uVar3 = 0xff;
        local_310 = (char *)0x0;
        __s = local_1e8;
        break;
      }
      local_300 = &stack0x00000008;
      local_308 = 0x3000000010;
      local_2f8 = local_e8;
      uVar3 = vsnprintf(local_310,(ulong)uVar10,fmt,&local_308);
      bVar1 = (int)uVar10 <= (int)uVar3;
      bVar8 = (int)uVar3 < 0 || bVar1;
      __arg = (undefined8 *)(ulong)bVar8;
      __s = local_310;
      uVar9 = uVar3;
    } while (bVar8);
  }
  iVar4 = mbtowc((wchar_t *)0x0,(char *)0x0,1);
  if (iVar4 != -1) {
    cVar2 = *__s;
    buffsize = 0;
    if (cVar2 != '\0') {
      bVar1 = true;
      do {
        if (bVar1) {
          iVar4 = mbtowc(&local_31c,__s,(long)(int)uVar3);
          if (iVar4 == -1) {
            cVar2 = *__s;
            goto LAB_0010e465;
          }
          uVar3 = uVar3 - iVar4;
          iVar5 = iswprint(local_31c);
          if ((iVar5 != 0) && (local_31c != L'\\')) {
            if (iVar4 < 1) goto LAB_0010e4d8;
            pcVar6 = local_2e8 + buffsize;
            __arg = (undefined8 *)(ulong)(iVar4 + 1);
            do {
              cVar2 = *__s;
              __s = __s + 1;
              *pcVar6 = cVar2;
              pcVar6 = pcVar6 + 1;
              uVar10 = (int)__arg - 1;
              __arg = (undefined8 *)(ulong)uVar10;
            } while (1 < uVar10);
            buffsize = (size_t)(uint)(iVar4 + (int)buffsize);
            goto LAB_0010e4b1;
          }
          if (0 < iVar4) {
            uVar10 = iVar4 + 1;
            do {
              cVar2 = *__s;
              __s = __s + 1;
              sVar7 = bsdtar_expand_char(local_2e8,buffsize,(ulong)(uint)(int)cVar2,(char)__arg);
              buffsize = (size_t)(uint)((int)sVar7 + (int)buffsize);
              uVar10 = uVar10 - 1;
            } while (1 < uVar10);
            goto LAB_0010e4b1;
          }
        }
        else {
LAB_0010e465:
          __s = __s + 1;
          sVar7 = bsdtar_expand_char(local_2e8,buffsize,(ulong)(uint)(int)cVar2,(char)__arg);
          bVar1 = false;
          buffsize = (size_t)(uint)((int)sVar7 + (int)buffsize);
LAB_0010e4b1:
          if (0x80 < (uint)buffsize) {
            local_2e8[buffsize] = '\0';
            fputs(local_2e8,local_318);
            buffsize = 0;
          }
        }
LAB_0010e4d8:
        cVar2 = *__s;
      } while (cVar2 != '\0');
    }
    local_2e8[buffsize] = '\0';
    fputs(local_2e8,local_318);
  }
  free(local_310);
  return;
}

Assistant:

void
safe_fprintf(FILE *f, const char *fmt, ...)
{
	char fmtbuff_stack[256]; /* Place to format the printf() string. */
	char outbuff[256]; /* Buffer for outgoing characters. */
	char *fmtbuff_heap; /* If fmtbuff_stack is too small, we use malloc */
	char *fmtbuff;  /* Pointer to fmtbuff_stack or fmtbuff_heap. */
	int fmtbuff_length;
	int length, n;
	va_list ap;
	const char *p;
	unsigned i;
	wchar_t wc;
	char try_wc;

	/* Use a stack-allocated buffer if we can, for speed and safety. */
	fmtbuff_heap = NULL;
	fmtbuff_length = sizeof(fmtbuff_stack);
	fmtbuff = fmtbuff_stack;

	/* Try formatting into the stack buffer. */
	va_start(ap, fmt);
	length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
	va_end(ap);

	/* If the result was too large, allocate a buffer on the heap. */
	while (length < 0 || length >= fmtbuff_length) {
		if (length >= fmtbuff_length)
			fmtbuff_length = length+1;
		else if (fmtbuff_length < 8192)
			fmtbuff_length *= 2;
		else if (fmtbuff_length < 1000000)
			fmtbuff_length += fmtbuff_length / 4;
		else {
			length = fmtbuff_length;
			fmtbuff_heap[length-1] = '\0';
			break;
		}
		free(fmtbuff_heap);
		fmtbuff_heap = malloc(fmtbuff_length);

		/* Reformat the result into the heap buffer if we can. */
		if (fmtbuff_heap != NULL) {
			fmtbuff = fmtbuff_heap;
			va_start(ap, fmt);
			length = vsnprintf(fmtbuff, fmtbuff_length, fmt, ap);
			va_end(ap);
		} else {
			/* Leave fmtbuff pointing to the truncated
			 * string in fmtbuff_stack. */
			fmtbuff = fmtbuff_stack;
			length = sizeof(fmtbuff_stack) - 1;
			break;
		}
	}

	/* Note: mbrtowc() has a cleaner API, but mbtowc() seems a bit
	 * more portable, so we use that here instead. */
	if (mbtowc(NULL, NULL, 1) == -1) { /* Reset the shift state. */
		/* mbtowc() should never fail in practice, but
		 * handle the theoretical error anyway. */
		free(fmtbuff_heap);
		return;
	}

	/* Write data, expanding unprintable characters. */
	p = fmtbuff;
	i = 0;
	try_wc = 1;
	while (*p != '\0') {

		/* Convert to wide char, test if the wide
		 * char is printable in the current locale. */
		if (try_wc && (n = mbtowc(&wc, p, length)) != -1) {
			length -= n;
			if (iswprint(wc) && wc != L'\\') {
				/* Printable, copy the bytes through. */
				while (n-- > 0)
					outbuff[i++] = *p++;
			} else {
				/* Not printable, format the bytes. */
				while (n-- > 0)
					i += (unsigned)bsdtar_expand_char(
					    outbuff, sizeof(outbuff), i, *p++);
			}
		} else {
			/* After any conversion failure, don't bother
			 * trying to convert the rest. */
			i += (unsigned)bsdtar_expand_char(outbuff, sizeof(outbuff), i, *p++);
			try_wc = 0;
		}

		/* If our output buffer is full, dump it and keep going. */
		if (i > (sizeof(outbuff) - 128)) {
			outbuff[i] = '\0';
			fprintf(f, "%s", outbuff);
			i = 0;
		}
	}
	outbuff[i] = '\0';
	fprintf(f, "%s", outbuff);

	/* If we allocated a heap-based formatting buffer, free it now. */
	free(fmtbuff_heap);
}